

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::
AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,std::__cxx11::string>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          char *more,char *more_1,char *more_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_1_00;
  char *more_00;
  char *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local_3;
  char *more_local_2;
  char *more_local_1;
  char *more_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  Node *this_local;
  
  local_38 = more_3;
  more_local_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)more_2;
  more_local_2 = more_1;
  more_local_1 = more;
  more_local = (char *)value;
  value_local = &this->name;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  value_00 = more_local_1;
  more_00 = more_local_2;
  more_1_00 = more_local_3;
  std::__cxx11::string::string((string *)&local_58,(string *)more_3);
  AddProperties<char_const*,char_const*,char_const*,std::__cxx11::string>
            (this,value_00,more_00,(char *)more_1_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }